

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O3

void __thiscall
SolverTest_HandleUnknownOption_Test::TestBody::TestSolver::~TestSolver(TestSolver *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pSVar3;
  
  (this->super_Solver).super_BasicSolver.super_ErrorHandler._vptr_ErrorHandler =
       (_func_int **)&PTR__TestSolver_00287ba8;
  (this->super_Solver).super_BasicSolver.super_OutputHandler._vptr_OutputHandler =
       (_func_int **)&PTR__TestSolver_00287c18;
  (this->super_Solver).super_BasicSolver.super_Interrupter._vptr_Interrupter =
       (_func_int **)&PTR__TestSolver_00287c40;
  (this->super_Solver).super_BasicSolver.super_SolverOptionManager._vptr_SolverOptionManager =
       (_func_int **)&PTR__TestSolver_00287c70;
  (this->super_Solver).super_BasicSolver.super_SolveResultRegistry._vptr_SolveResultRegistry =
       (_func_int **)&PTR__TestSolver_00287c90;
  pcVar2 = (this->option_name)._M_dataplus._M_p;
  paVar1 = &(this->option_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_Solver).super_BasicSolver.super_ErrorHandler._vptr_ErrorHandler =
       (_func_int **)&PTR__Solver_00287fd8;
  (this->super_Solver).super_BasicSolver.super_OutputHandler._vptr_OutputHandler =
       (_func_int **)&PTR__Solver_00288048;
  (this->super_Solver).super_BasicSolver.super_Interrupter._vptr_Interrupter =
       (_func_int **)&PTR__Solver_00288070;
  (this->super_Solver).super_BasicSolver.super_SolverOptionManager._vptr_SolverOptionManager =
       (_func_int **)&PTR__Solver_002880a0;
  (this->super_Solver).super_BasicSolver.super_SolveResultRegistry._vptr_SolveResultRegistry =
       (_func_int **)&PTR__Solver_002880c0;
  pSVar3 = (this->super_Solver).suffixes_.
           super__Vector_base<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pSVar3 != (pointer)0x0) {
    operator_delete(pSVar3,(long)(this->super_Solver).suffixes_.
                                 super__Vector_base<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar3);
  }
  mp::BasicSolver::~BasicSolver((BasicSolver *)this);
  operator_delete(this,800);
  return;
}

Assistant:

TEST(SolverTest, HandleUnknownOption) {
  struct TestSolver : Solver {
    std::string option_name;
    TestSolver() : Solver("test", 0, 0, 0) {}
    int DoSolve(Problem &, SolutionHandler &) { return 0; }
    void ReadNL(fmt::StringRef) {}
    void HandleUnknownOption(const char *name) { option_name = name; }
  };
  TestSolver s;
  s.ParseOptions(Args("BadOption"));
  EXPECT_EQ("BadOption", s.option_name);
}